

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

uint32_t __thiscall
cppnet::BufferQueue::Read(BufferQueue *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  element_type *peVar1;
  long lVar2;
  long lVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint uVar6;
  uint uVar7;
  long *plVar8;
  BufferBlock *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  element_type *peVar10;
  uint32_t uVar11;
  bool bVar12;
  long local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  List<cppnet::BufferBlock> *local_48;
  element_type *local_38;
  
  uVar11 = 0;
  if ((buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    if (len == 0) {
      len = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[8])();
    }
    uVar11 = 0;
    if (len != 0) {
      peVar1 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        plVar8 = (long *)0x0;
      }
      else {
        plVar8 = (long *)__dynamic_cast(peVar1,&InnerBuffer::typeinfo,&typeinfo,0);
      }
      if (plVar8 == (long *)0x0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        plVar8 = (long *)0x0;
      }
      else {
        this_01 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_01->_M_use_count = this_01->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_01->_M_use_count = this_01->_M_use_count + 1;
          }
        }
      }
      if (plVar8[7] == 0) {
        (**(code **)(*plVar8 + 0x98))(plVar8);
        lVar2 = plVar8[5];
        lVar3 = plVar8[6];
        if (lVar3 != 0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
            UNLOCK();
          }
          else {
            *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
          }
        }
        plVar8[7] = lVar2;
        p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[8];
        plVar8[8] = lVar3;
        if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
        }
      }
      uVar6 = (**(code **)(*(long *)plVar8[7] + 0x58))();
      peVar10 = (this->_buffer_list)._head.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var9 = (this->_buffer_list)._head.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var9->_M_use_count = p_Var9->_M_use_count + 1;
        }
      }
      local_48 = &this->_buffer_list;
      uVar11 = 0;
      do {
        if (peVar10 == (element_type *)0x0) break;
        local_58 = plVar8[7];
        local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[8];
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_50->_M_use_count = local_50->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_50->_M_use_count = local_50->_M_use_count + 1;
          }
        }
        uVar7 = (*(peVar10->super_InnerBuffer).super_Buffer._vptr_Buffer[0xc])
                          (peVar10,&local_58,(ulong)uVar6);
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
        uVar11 = uVar11 + uVar7;
        bVar12 = uVar6 < uVar7;
        uVar6 = uVar6 - uVar7;
        if (bVar12 || uVar6 == 0) {
          if (len <= uVar11) break;
          (**(code **)(*plVar8 + 0x98))(plVar8);
          lVar2 = plVar8[5];
          lVar3 = plVar8[6];
          if (lVar3 != 0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
              UNLOCK();
            }
            else {
              *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
            }
          }
          plVar8[7] = lVar2;
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[8];
          plVar8[8] = lVar3;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          }
          uVar6 = (**(code **)(*(long *)plVar8[7] + 0x58))();
          p_Var5 = p_Var9;
        }
        else {
          peVar4 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar10 == peVar4) {
            peVar10 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._next.
                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var5 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._next.
                     super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              }
            }
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
            }
            if (peVar10 == (element_type *)0x0) {
              (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x12])(this);
              break;
            }
            peVar10 = (this->_buffer_write).
                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            peVar4 = (peVar10->super_ListSlot<cppnet::BufferBlock>)._next.
                     super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var5 = (peVar10->super_ListSlot<cppnet::BufferBlock>)._next.
                     super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi;
            if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              }
            }
            (this->_buffer_write).
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
            this_00 = (this->_buffer_write).
                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
            (this->_buffer_write).
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 p_Var5;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
          }
          List<cppnet::BufferBlock>::PopFront((List<cppnet::BufferBlock> *)&stack0xffffffffffffffc0)
          ;
          if (local_38 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
          }
          peVar10 = (this->_buffer_list)._head.
                    super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          p_Var5 = (this->_buffer_list)._head.
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
          if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            }
          }
          if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
          }
        }
        p_Var9 = p_Var5;
      } while (uVar11 < len);
      this->_can_read_length = this->_can_read_length - uVar11;
      *(uint32_t *)(plVar8 + 1) = (int)plVar8[1] + uVar11;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
  }
  return uVar11;
}

Assistant:

uint32_t BufferQueue::Read(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!buffer) {
        return 0;
    }
    
    if (len == 0) {
        len = GetCanReadLength();
    } 
    if (len == 0) {
        return 0;
    }

    std::shared_ptr<BufferQueue> buffer_queue = std::dynamic_pointer_cast<BufferQueue>(buffer);
    if (!buffer_queue->_buffer_write) {
        buffer_queue->Append();
        buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
    }

    uint32_t can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();
    uint32_t total_read_len = 0;
    uint32_t cur_read_len = 0;

    auto buffer_read = _buffer_list.GetHead();
    while (buffer_read) {
        cur_read_len = buffer_read->Read(buffer_queue->_buffer_write, can_write_size);
        total_read_len += cur_read_len;

        // current write block is full
        if (cur_read_len >= can_write_size) {
            if (total_read_len >= len) {
                break;
            }

            buffer_queue->Append();
            buffer_queue->_buffer_write = buffer_queue->_buffer_list.GetTail();
            can_write_size = buffer_queue->_buffer_write->GetCanWriteLength();

        // current read block is empty
        } else {
            can_write_size -= cur_read_len;
            if (buffer_read == _buffer_write) {
                if (_buffer_write->GetNext()) {
                    _buffer_write = _buffer_write->GetNext();

                } else {
                    Reset();
                    break;
                }
            }
            _buffer_list.PopFront();
            buffer_read = _buffer_list.GetHead();
        }

        if (total_read_len >= len) {
            break;
        }
    }
    _can_read_length -= total_read_len;
    buffer_queue->_can_read_length += total_read_len;
    return total_read_len;
}